

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void cm_wake_any_pending_write(CMConnection conn)

{
  ulong uVar1;
  FILE *pFVar2;
  CMControlList p_Var3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  ulong uVar7;
  void **ppvVar8;
  bool bVar9;
  timespec ts;
  CMConnHandlerListEntry callbacks [16];
  
  if (conn->write_callbacks == (CMConnHandlerList)0x0) {
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(conn->cm,CMTransportVerbose);
      if (iVar4 == 0) goto LAB_0011ed8e;
    }
    else if (CMtrace_val[5] == 0) goto LAB_0011ed8e;
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)conn->cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)callbacks);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",callbacks[0].func,
              callbacks[0].client_data);
    }
    fwrite("Completed pending write, No notifications\n",0x2a,1,(FILE *)conn->cm->CMTrace_file);
  }
  else {
    uVar1 = conn->write_callback_len;
    if (0x10 < uVar1) {
      __assert_fail("conn->write_callback_len <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xb62,"void cm_wake_any_pending_write(CMConnection)");
    }
    memcpy(callbacks,conn->write_callbacks,uVar1 << 4);
    ppvVar8 = &callbacks[0].client_data;
    uVar7 = uVar1;
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      if (((CMConnHandlerListEntry *)(ppvVar8 + -1))->func != (CMCloseHandlerFunc)0x0) {
        (*((CMConnHandlerListEntry *)(ppvVar8 + -1))->func)(conn->cm,conn,*ppvVar8);
      }
      ppvVar8 = ppvVar8 + 2;
    }
    iVar4 = CMtrace_val[5];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(conn->cm,CMTransportVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)conn->cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"Completed pending write, did %d notifications\n",
              uVar1 & 0xffffffff);
    }
  }
LAB_0011ed8e:
  fflush((FILE *)conn->cm->CMTrace_file);
  p_Var3 = conn->cm->control_list;
  (*p_Var3->wake_select)(&CMstatic_trans_svcs,&p_Var3->select_data);
  return;
}

Assistant:

static void
 cm_wake_any_pending_write(CMConnection conn)
 {
     if (conn->write_callbacks) {
	 int i = 0;
	 CMConnHandlerListEntry callbacks[16];
	 size_t callback_len = conn->write_callback_len;
	 assert(conn->write_callback_len <= 16);
	 memcpy(callbacks, conn->write_callbacks, sizeof(callbacks[0]) * conn->write_callback_len);
	 for (i = 0; i < callback_len; ++i) {
	     if (callbacks[i].func) {
		 (callbacks[i].func)(conn->cm, conn, callbacks[i].client_data);
	     }
	 }
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, did %d notifications\n", i);
     } else {
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, No notifications\n");
     }
     CMwake_server_thread(conn->cm);
 }